

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt,xmlChar *name)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  xmlXPathObjectPtr value;
  int d;
  int overflow;
  int child;
  xmlChar *name_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (((name == (xmlChar *)0x0) && (*ctxt->cur == '/')) && (ctxt->cur[1] != '1')) {
    xmlXPtrErr(ctxt,0x76d,"warning: ChildSeq not starting by /1\n",(xmlChar *)0x0);
  }
  if (name != (xmlChar *)0x0) {
    value = xmlXPathNewString(name);
    valuePush(ctxt,value);
    (*xmlFree)(name);
    xmlXPathIdFunction(ctxt,1);
    if (ctxt->error != 0) {
      return;
    }
  }
  while (*ctxt->cur == '/') {
    d = 0;
    bVar2 = false;
    if (*ctxt->cur != '\0') {
      ctxt->cur = ctxt->cur + 1;
    }
    while( true ) {
      bVar1 = false;
      if (0x2f < *ctxt->cur) {
        bVar1 = *ctxt->cur < 0x3a;
      }
      if (!bVar1) break;
      iVar3 = *ctxt->cur - 0x30;
      if (d < 0xccccccd) {
        d = d * 10;
      }
      else {
        bVar2 = true;
      }
      if (0x7fffffff - iVar3 < d) {
        bVar2 = true;
      }
      else {
        d = iVar3 + d;
      }
      if (*ctxt->cur != '\0') {
        ctxt->cur = ctxt->cur + 1;
      }
    }
    if (bVar2) {
      d = 0;
    }
    xmlXPtrGetChildNo(ctxt,d);
  }
  return;
}

Assistant:

static void
xmlXPtrEvalChildSeq(xmlXPathParserContextPtr ctxt, xmlChar *name) {
    /*
     * XPointer don't allow by syntax to address in multirooted trees
     * this might prove useful in some cases, warn about it.
     */
    if ((name == NULL) && (CUR == '/') && (NXT(1) != '1')) {
        xmlXPtrErr(ctxt, XML_XPTR_CHILDSEQ_START,
		   "warning: ChildSeq not starting by /1\n", NULL);
    }

    if (name != NULL) {
	valuePush(ctxt, xmlXPathNewString(name));
	xmlFree(name);
	xmlXPathIdFunction(ctxt, 1);
	CHECK_ERROR;
    }

    while (CUR == '/') {
	int child = 0, overflow = 0;
	NEXT;

	while ((CUR >= '0') && (CUR <= '9')) {
            int d = CUR - '0';
            if (child > INT_MAX / 10)
                overflow = 1;
            else
                child *= 10;
            if (child > INT_MAX - d)
                overflow = 1;
            else
                child += d;
	    NEXT;
	}
        if (overflow)
            child = 0;
	xmlXPtrGetChildNo(ctxt, child);
    }
}